

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

ModportPortSymbol *
slang::ast::ModportPortSymbol::fromSyntax
          (ASTContext *parentContext,ArgumentDirection direction,ModportExplicitPortSyntax *syntax)

{
  bool bVar1;
  int iVar2;
  Compilation *args;
  SourceLocation expr_00;
  ModportPortSymbol *this;
  undefined4 extraout_var;
  SyntaxNode *in_RDX;
  int in_ESI;
  SourceLocation *in_RDI;
  string_view sVar3;
  Expression *expr;
  bitmask<slang::ast::ASTFlags> extraFlags;
  ModportPortSymbol *result;
  Token name;
  Compilation *comp;
  ASTContext context;
  Type *in_stack_fffffffffffffef8;
  ModportPortSymbol *type;
  ValueSymbol *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff10;
  ArgumentDirection *in_stack_ffffffffffffff18;
  BumpAllocator *in_stack_ffffffffffffff30;
  bitmask<slang::ast::ASTFlags> local_b0;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff58;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff60;
  ArgumentDirection direction_00;
  unkbyte9 Var4;
  SyntaxNode *local_78;
  Info *local_70;
  Compilation *local_68;
  underlying_type local_60;
  sockaddr local_58 [3];
  SyntaxNode *local_20;
  int local_14;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_60 = (underlying_type)
             ast::operator|(CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                            (ASTFlags)in_stack_ffffffffffffff00);
  ASTContext::resetFlags
            ((ASTContext *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             in_stack_ffffffffffffff10);
  args = ASTContext::getCompilation((ASTContext *)0x90917e);
  local_78 = local_20[1].previewNode;
  local_70 = *(Info **)(local_20 + 2);
  local_68 = args;
  sVar3 = parsing::Token::valueText((Token *)in_stack_ffffffffffffff10.m_bits);
  Var4 = sVar3._7_9_;
  expr_00 = parsing::Token::location((Token *)&local_78);
  this = BumpAllocator::
         emplace<slang::ast::ModportPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&>
                   (in_stack_ffffffffffffff30,
                    (basic_string_view<char,_std::char_traits<char>_> *)args,in_RDI,
                    in_stack_ffffffffffffff18);
  Symbol::setSyntax((Symbol *)this,local_20);
  if (*(long *)(local_20 + 3) == 0) {
    Compilation::getVoidType(local_68);
    ValueSymbol::setType(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  else {
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff60);
    if (((local_14 == 1) || (local_14 == 2)) &&
       (bitmask<slang::ast::ASTFlags>::bitmask
                  ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff58,LValue),
       in_stack_ffffffffffffff60.m_bits = in_stack_ffffffffffffff58.m_bits, local_14 == 2)) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_b0,LAndRValue);
      bitmask<slang::ast::ASTFlags>::operator|=
                ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff60,&local_b0);
    }
    iVar2 = Expression::bind((int)*(undefined8 *)(local_20 + 3),local_58,
                             (socklen_t)in_stack_ffffffffffffff60.m_bits);
    direction_00 = (ArgumentDirection)(in_stack_ffffffffffffff60.m_bits >> 0x20);
    this->explicitConnection = (Expression *)CONCAT44(extraout_var,iVar2);
    this->connExpr = (Expression *)CONCAT44(extraout_var,iVar2);
    bVar1 = Expression::bad((Expression *)in_stack_ffffffffffffff00);
    if (bVar1) {
      Compilation::getErrorType(local_68);
      ValueSymbol::setType(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    else {
      type = this;
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x909384);
      ValueSymbol::setType(in_stack_ffffffffffffff00,(Type *)type);
      memset(&stack0xffffffffffffff37,0,1);
      bitmask<slang::ast::AssignFlags>::bitmask
                ((bitmask<slang::ast::AssignFlags> *)&stack0xffffffffffffff37);
      Expression::checkConnectionDirection
                ((Expression *)expr_00,direction_00,(ASTContext *)in_stack_ffffffffffffff58.m_bits,
                 SUB98((unkuint9)Var4 >> 8,0),
                 (bitmask<slang::ast::AssignFlags>)(underlying_type)Var4);
    }
  }
  return this;
}

Assistant:

ModportPortSymbol& ModportPortSymbol::fromSyntax(const ASTContext& parentContext,
                                                 ArgumentDirection direction,
                                                 const ModportExplicitPortSyntax& syntax) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural | ASTFlags::NotADriver);
    auto& comp = context.getCompilation();
    auto name = syntax.name;
    auto result = comp.emplace<ModportPortSymbol>(name.valueText(), name.location(), direction);
    result->setSyntax(syntax);

    if (!syntax.expr) {
        result->setType(comp.getVoidType());
        return *result;
    }

    bitmask<ASTFlags> extraFlags;
    if (direction == ArgumentDirection::Out || direction == ArgumentDirection::InOut) {
        extraFlags = ASTFlags::LValue;
        if (direction == ArgumentDirection::InOut)
            extraFlags |= ASTFlags::LAndRValue;
    }

    auto& expr = Expression::bind(*syntax.expr, context, extraFlags);
    result->explicitConnection = &expr;
    result->connExpr = &expr;
    if (expr.bad()) {
        result->setType(comp.getErrorType());
        return *result;
    }

    result->setType(*expr.type);

    Expression::checkConnectionDirection(expr, direction, context, result->location);

    return *result;
}